

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O0

int AddrHash(NETADDR *pAddr)

{
  NETADDR *pAddr_local;
  uint local_4;
  
  if (pAddr->type == 1) {
    local_4 = (uint)pAddr->ip[0] + (uint)pAddr->ip[1] + (uint)pAddr->ip[2] + (uint)pAddr->ip[3];
  }
  else {
    local_4 = (uint)pAddr->ip[0] + (uint)pAddr->ip[1] + (uint)pAddr->ip[2] + (uint)pAddr->ip[3] +
              (uint)pAddr->ip[4] + (uint)pAddr->ip[5] + (uint)pAddr->ip[6] + (uint)pAddr->ip[7] +
              (uint)pAddr->ip[8] + (uint)pAddr->ip[9] + (uint)pAddr->ip[10] + (uint)pAddr->ip[0xb] +
              (uint)pAddr->ip[0xc] + (uint)pAddr->ip[0xd] + (uint)pAddr->ip[0xe] +
              (uint)pAddr->ip[0xf];
  }
  local_4 = local_4 & 0xff;
  return local_4;
}

Assistant:

inline int AddrHash(const NETADDR *pAddr)
{
	if(pAddr->type==NETTYPE_IPV4)
		return (pAddr->ip[0]+pAddr->ip[1]+pAddr->ip[2]+pAddr->ip[3])&0xFF;
	else
		return (pAddr->ip[0]+pAddr->ip[1]+pAddr->ip[2]+pAddr->ip[3]+pAddr->ip[4]+pAddr->ip[5]+pAddr->ip[6]+pAddr->ip[7]+
			pAddr->ip[8]+pAddr->ip[9]+pAddr->ip[10]+pAddr->ip[11]+pAddr->ip[12]+pAddr->ip[13]+pAddr->ip[14]+pAddr->ip[15])&0xFF;
}